

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_> * __thiscall
MPL::detail::ModelPackageImpl::findItemsByAuthor
          (vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>
           *__return_storage_ptr__,ModelPackageImpl *this,string *author)

{
  undefined8 uVar1;
  __type _Var2;
  undefined8 uVar3;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  shared_ptr<MPL::ModelPackageItemInfo> itemInfo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  identifiers;
  undefined1 local_60 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getItemInfoEntries((ModelPackageImpl *)local_60);
  if ((JsonMap *)local_60._0_8_ != (JsonMap *)0x0) {
    local_48._0_8_ = 0;
    local_48._8_8_ = 0;
    local_38._M_p = (pointer)0x0;
    JsonMap::getKeys((JsonMap *)local_60._0_8_,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48);
    uVar1 = local_48._8_8_;
    for (uVar3 = local_48._0_8_; uVar3 != uVar1; uVar3 = uVar3 + 0x20) {
      findItem((ModelPackageImpl *)(local_60 + 8),(string *)this);
      _Var2 = std::operator==(&((((shared_ptr<MPL::detail::ModelPackageItemInfoImpl> *)
                                 local_60._8_8_)->
                                super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->m_author,author);
      if (_Var2) {
        std::vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>::
        push_back(__return_storage_ptr__,(value_type *)local_60._8_8_);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
  }
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ModelPackageItemInfo> ModelPackageImpl::findItemsByAuthor(const std::string& author) const
{
    auto itemInfoVector = std::vector<ModelPackageItemInfo>();
    auto itemInfoEntries = getItemInfoEntries();
    if (itemInfoEntries != nullptr) {
        std::vector<std::string> identifiers;
        itemInfoEntries->getKeys(identifiers);
        for (const auto& identifier : identifiers) {
            auto itemInfo = findItem(identifier);
        	if (itemInfo->author() == author) {
	            itemInfoVector.push_back(*itemInfo);
	        }
        }
    }
    
    return itemInfoVector;
}